

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDefinedSymbol,_2UL>::Construct
                   (DB *db,LIST *params)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x60);
  puVar1[10] = 0;
  puVar1[0xb] = "IfcDefinedSymbol";
  puVar1[5] = 0;
  *puVar1 = 0x83a4f0;
  puVar1[9] = 0x83a568;
  puVar1[2] = 0x83a518;
  puVar1[4] = 0x83a540;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  return (Object *)(puVar1 + 9);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }